

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O0

DSFrame * __thiscall
AVSInterface::AVSFetchFrameFunctor::operator()
          (DSFrame *__return_storage_ptr__,AVSFetchFrameFunctor *this,int n)

{
  IClip *pIVar1;
  PVideoFrame local_30;
  PVideoFrame frame;
  lock_guard<std::mutex> guard;
  int n_local;
  AVSFetchFrameFunctor *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&frame,&this->fetch_frame_mutex)
  ;
  pIVar1 = PClip::operator->(&this->_clip);
  (*pIVar1->_vptr_IClip[1])(&local_30,pIVar1,(ulong)(uint)n,this->_env);
  DSFrame::DSFrame(__return_storage_ptr__,&local_30,this->_vi,this->_env);
  PVideoFrame::~PVideoFrame(&local_30);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&frame);
  return __return_storage_ptr__;
}

Assistant:

DSFrame operator()(int n) override {
      std::lock_guard<std::mutex> guard(fetch_frame_mutex);
      auto frame = _clip->GetFrame(n, _env);
      return DSFrame(frame, _vi, _env);
    }